

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_ChangeCountFlags
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  PClass *pPVar2;
  uint uVar3;
  PClass *pPVar4;
  uint uVar5;
  int iVar6;
  undefined8 *puVar7;
  int iVar8;
  char *pcVar9;
  bool bVar10;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar9 = "(paramnum) < numparam";
    goto LAB_003d9bc8;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d9bb8:
    pcVar9 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d9bc8:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x11cf,
                  "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  puVar7 = (undefined8 *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (puVar7 == (undefined8 *)0x0) goto LAB_003d9a3c;
    pPVar4 = (PClass *)puVar7[1];
    if (pPVar4 == (PClass *)0x0) {
      pPVar4 = (PClass *)(**(code **)*puVar7)(puVar7);
      puVar7[1] = pPVar4;
    }
    bVar10 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar2 && bVar10) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar10 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar2) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar10) {
      pcVar9 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d9bc8;
    }
  }
  else {
    if (puVar7 != (undefined8 *)0x0) goto LAB_003d9bb8;
LAB_003d9a3c:
    puVar7 = (undefined8 *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d9c18:
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x11d0,
                    "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar6 = param[1].field_0.i;
LAB_003d9a8b:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d9c37:
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x11d1,
                    "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar8 = param[2].field_0.i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar9 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d9c18;
    }
    iVar6 = param[1].field_0.i;
    if (numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003d9a8b;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar9 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d9c37;
    }
    iVar8 = param[2].field_0.i;
    if (numparam != 3) {
      if (param[3].field_0.field_3.Type != '\0') {
        pcVar9 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003d9be7;
      }
      goto LAB_003d9aa5;
    }
    param = defaultparam->Array;
  }
  if (param[3].field_0.field_3.Type != '\0') {
    pcVar9 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d9be7:
    __assert_fail(pcVar9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x11d2,
                  "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_003d9aa5:
  iVar1 = param[3].field_0.i;
  uVar3 = *(uint *)((long)puVar7 + 0x1bc);
  if (((uVar3 & 0x8400000) == 0x400000) && (0 < *(int *)((long)puVar7 + 0x1fc))) {
    level.total_monsters = level.total_monsters + -1;
  }
  if ((uVar3 >> 0x17 & 1) != 0) {
    level.total_items = level.total_items + -1;
  }
  uVar5 = *(uint *)((long)puVar7 + 0x1cc);
  if ((uVar5 & 0x10) != 0) {
    level.total_secrets = level.total_secrets + -1;
  }
  if (iVar6 != -1) {
    if (iVar6 == 0) {
      uVar3 = uVar3 & 0xffbfffff;
    }
    else {
      uVar3 = uVar3 | 0x400000;
    }
    *(uint *)((long)puVar7 + 0x1bc) = uVar3;
  }
  if (iVar8 != -1) {
    if (iVar8 == 0) {
      uVar3 = uVar3 & 0xff7fffff;
    }
    else {
      uVar3 = uVar3 | 0x800000;
    }
    *(uint *)((long)puVar7 + 0x1bc) = uVar3;
  }
  if (iVar1 != -1) {
    if (iVar1 == 0) {
      uVar5 = uVar5 & 0xffffffef;
    }
    else {
      uVar5 = uVar5 | 0x10;
    }
    *(uint *)((long)puVar7 + 0x1cc) = uVar5;
  }
  if (((uVar3 & 0x8400000) == 0x400000) && (0 < *(int *)((long)puVar7 + 0x1fc))) {
    level.total_monsters = level.total_monsters + 1;
  }
  if ((uVar3 >> 0x17 & 1) != 0) {
    level.total_items = level.total_items + 1;
  }
  if ((uVar5 & 0x10) != 0) {
    level.total_secrets = level.total_secrets + 1;
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ChangeCountFlags)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(kill);
	PARAM_INT_DEF(item);
	PARAM_INT_DEF(secret);

	if (self->CountsAsKill() && self->health > 0) --level.total_monsters;
	if (self->flags & MF_COUNTITEM) --level.total_items;
	if (self->flags5 & MF5_COUNTSECRET) --level.total_secrets;

	if (kill != -1)
	{
		if (kill == 0) self->flags &= ~MF_COUNTKILL;
		else self->flags |= MF_COUNTKILL;
	}

	if (item != -1)
	{
		if (item == 0) self->flags &= ~MF_COUNTITEM;
		else self->flags |= MF_COUNTITEM;
	}

	if (secret != -1)
	{
		if (secret == 0) self->flags5 &= ~MF5_COUNTSECRET;
		else self->flags5 |= MF5_COUNTSECRET;
	}
	if (self->CountsAsKill() && self->health > 0) ++level.total_monsters;
	if (self->flags & MF_COUNTITEM) ++level.total_items;
	if (self->flags5 & MF5_COUNTSECRET) ++level.total_secrets;
	return 0;
}